

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize&,capnp::ElementSize>&,char_const(&)[65]>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *params,char (*params_1) [65])

{
  long lVar1;
  undefined8 uVar2;
  char (*params_00) [65];
  long lVar3;
  String argValues [2];
  char **ppcVar4;
  undefined8 uVar5;
  char *local_98;
  size_t local_90;
  ArrayDisposer *pAStack_88;
  String local_80;
  StringPtr local_68;
  char *local_58;
  undefined8 local_50;
  String local_48;
  
  this->exception = (Exception *)0x0;
  local_58 = "(can\'t stringify)";
  local_50 = 0x12;
  local_68.content.ptr = "(can\'t stringify)";
  local_68.content.size_ = 0x12;
  concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
            (&local_48,(_ *)&local_58,&params->op,&local_68,(StringPtr *)condition);
  local_98 = local_48.content.ptr;
  local_90 = local_48.content.size_;
  pAStack_88 = local_48.content.disposer;
  str<char_const(&)[65]>(&local_80,(kj *)params_1,params_00);
  ppcVar4 = &local_98;
  uVar5 = 2;
  init(this,(EVP_PKEY_CTX *)file);
  lVar3 = 0x18;
  do {
    lVar1 = *(long *)((long)&local_98 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_90 + lVar3);
      *(undefined8 *)((long)&local_98 + lVar3) = 0;
      *(undefined8 *)((long)&local_90 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&pAStack_88 + lVar3))
                (*(undefined8 **)((long)&pAStack_88 + lVar3),lVar1,1,uVar2,uVar2,0,ppcVar4,uVar5);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}